

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O2

void uavs3d_funs_init_c(void)

{
  uavs3d_funs_init_mc_c();
  uavs3d_funs_init_deblock_c();
  uavs3d_funs_init_sao_c();
  uavs3d_funs_init_alf_c();
  uavs3d_funs_init_intra_pred_c();
  uavs3d_funs_handle.padding_rows_luma = padding_rows_luma;
  uavs3d_funs_handle.padding_rows_chroma = padding_rows_chroma;
  uavs3d_funs_handle.conv_fmt_8bit = conv_fmt_8bit_c;
  uavs3d_funs_handle.conv_fmt_16bit = conv_fmt_16bit_c;
  uavs3d_funs_handle.conv_fmt_16to8bit = conv_fmt_16to8bit_c;
  uavs3d_funs_handle.reset_map_scu = reset_map_scu;
  uavs3d_funs_init_recon_c();
  uavs3d_funs_init_itrans_c();
  return;
}

Assistant:

void uavs3d_funs_init_c() {
    uavs3d_funs_init_mc_c();
    uavs3d_funs_init_deblock_c();
    uavs3d_funs_init_sao_c();
    uavs3d_funs_init_alf_c();
    uavs3d_funs_init_intra_pred_c();
    uavs3d_funs_init_pixel_opt_c();
    uavs3d_funs_init_recon_c();
    uavs3d_funs_init_itrans_c();
}